

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausSmlNodesAreImp(Fra_Sml_t *pSeq,Aig_Obj_t *pObj1,Aig_Obj_t *pObj2)

{
  uint *puVar1;
  uint *puVar2;
  int local_3c;
  int k;
  uint *pSimR;
  uint *pSimL;
  Aig_Obj_t *pObj2_local;
  Aig_Obj_t *pObj1_local;
  Fra_Sml_t *pSeq_local;
  
  puVar1 = Fra_ObjSim(pSeq,pObj1->Id);
  puVar2 = Fra_ObjSim(pSeq,pObj2->Id);
  local_3c = pSeq->nWordsPref;
  while( true ) {
    if (pSeq->nWordsTotal <= local_3c) {
      return 1;
    }
    if ((puVar1[local_3c] & (puVar2[local_3c] ^ 0xffffffff)) != 0) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Fra_ClausSmlNodesAreImp( Fra_Sml_t * pSeq, Aig_Obj_t * pObj1, Aig_Obj_t * pObj2 )
{
    unsigned * pSimL, * pSimR;
    int k;
    pSimL = Fra_ObjSim(pSeq, pObj1->Id);
    pSimR = Fra_ObjSim(pSeq, pObj2->Id);
    for ( k = pSeq->nWordsPref; k < pSeq->nWordsTotal; k++ )
        if ( pSimL[k] & ~pSimR[k] ) // !(Obj1 -> Obj2)
            return 0;
    return 1;
}